

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int exprCodeSubselect(Parse *pParse,Expr *pExpr)

{
  int iVar1;
  
  if (pExpr->op == 'w') {
    iVar1 = sqlite3CodeSubselect(pParse,pExpr,0,0);
    return iVar1;
  }
  return 0;
}

Assistant:

static int exprCodeSubselect(Parse *pParse, Expr *pExpr){
  int reg = 0;
#ifndef SQLITE_OMIT_SUBQUERY
  if( pExpr->op==TK_SELECT ){
    reg = sqlite3CodeSubselect(pParse, pExpr, 0, 0);
  }
#endif
  return reg;
}